

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int kex_method_curve25519_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  uchar **ppuVar1;
  size_t *outlen;
  libssh2_nonblocking_states lVar2;
  uint8_t *private_key;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  BIGNUM *pBVar14;
  size_t sVar15;
  uchar *puVar16;
  uchar *puVar17;
  LIBSSH2_CRYPT_METHOD *pLVar18;
  _LIBSSH2_MAC_METHOD *p_Var19;
  LIBSSH2_COMP_METHOD *pLVar20;
  size_t sVar21;
  char *pcVar22;
  ulong uVar23;
  long lVar24;
  uchar *puVar25;
  EVP_MD_CTX *fingerprint_ctx;
  uchar *server_public_key;
  uint local_8c;
  uchar *local_88;
  uchar *server_host_key;
  void **local_78;
  size_t server_public_key_len;
  uint local_64;
  uchar *s;
  uchar *local_58;
  ulong local_50;
  uchar **local_48;
  size_t *local_40;
  size_t hostkey_len;
  
  iVar6 = 0;
  switch(key_state->state) {
  case libssh2_NB_state_idle:
    goto switchD_00109619_caseD_0;
  default:
    goto switchD_00109619_caseD_1;
  case libssh2_NB_state_created:
    goto switchD_00109619_caseD_2;
  case libssh2_NB_state_sent:
    sVar21 = key_state->request_len;
    goto LAB_001096ea;
  case libssh2_NB_state_sent1:
    goto switchD_00109619_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_00109619_caseD_5;
  }
LAB_0010a4c0:
  (*session->free)(puVar17,&session->abstract);
LAB_0010a4cd:
  (*session->free)(puVar16,&session->abstract);
LAB_0010a4d4:
  iVar6 = -5;
  goto switchD_001097ba_caseD_1;
switchD_00109619_caseD_0:
  key_state->public_key_oct = (uchar *)0x0;
  key_state->state = libssh2_NB_state_created;
switchD_00109619_caseD_2:
  s = (uchar *)0x0;
  pcVar22 = session->kex->name;
  iVar6 = strcmp(pcVar22,"curve25519-sha256@libssh.org");
  if ((iVar6 != 0) && (iVar6 = strcmp(pcVar22,"curve25519-sha256"), iVar6 != 0)) {
    pcVar22 = "Unknown KEX curve25519 curve type";
    iVar6 = -1;
LAB_00109828:
    iVar6 = _libssh2_error(session,iVar6,pcVar22);
    goto switchD_00109619_caseD_1;
  }
  iVar6 = _libssh2_curve25519_new
                    (session,&key_state->curve25519_public_key,&key_state->curve25519_private_key);
  if (iVar6 != 0) {
    pcVar22 = "Unable to create private key";
    goto LAB_00109828;
  }
  key_state->request[0] = '\x1e';
  s = key_state->request + 1;
  _libssh2_store_str(&s,(char *)key_state->curve25519_public_key,0x20);
  key_state->request_len = 0x25;
  key_state->state = libssh2_NB_state_sent;
  sVar21 = 0x25;
LAB_001096ea:
  iVar6 = _libssh2_transport_send(session,key_state->request,sVar21,(uchar *)0x0,0);
  if (iVar6 == -0x25) {
    return -0x25;
  }
  if (iVar6 != 0) {
    pcVar22 = "Unable to send ECDH_INIT";
    goto LAB_00109828;
  }
  key_state->state = libssh2_NB_state_sent1;
switchD_00109619_caseD_4:
  iVar6 = _libssh2_packet_require
                    (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                     &key_state->req_state);
  if (iVar6 == -0x25) {
    return -0x25;
  }
  if (iVar6 != 0) {
    pcVar22 = "Timeout waiting for ECDH_REPLY reply";
    goto LAB_00109828;
  }
  key_state->state = libssh2_NB_state_sent2;
switchD_00109619_caseD_5:
  uVar23 = key_state->data_len;
  if (uVar23 < 5) {
    iVar6 = _libssh2_error(session,-10,"Data is too short");
  }
  else {
    lVar2 = (key_state->exchange_state).state;
    iVar6 = 0;
    if (libssh2_NB_state_sent2 < lVar2) goto switchD_001097ba_caseD_1;
    puVar16 = key_state->data;
    puVar17 = key_state->curve25519_public_key;
    private_key = key_state->curve25519_private_key;
    switch(lVar2) {
    case libssh2_NB_state_idle:
      pBVar14 = BN_new();
      (key_state->exchange_state).k = (BIGNUM *)pBVar14;
      (key_state->exchange_state).state = libssh2_NB_state_created;
      break;
    default:
      goto switchD_001097ba_caseD_1;
    case libssh2_NB_state_created:
      break;
    case libssh2_NB_state_sent:
      goto switchD_001097ba_caseD_3;
    case libssh2_NB_state_sent2:
      goto switchD_001097ba_caseD_5;
    }
    local_58 = puVar16 + 1;
    s = puVar16;
    local_50 = uVar23;
    iVar6 = _libssh2_get_string((string_buf *)&s,&server_host_key,&hostkey_len);
    if (iVar6 != 0) {
      pcVar22 = "Unexpected curve25519 key length 2";
LAB_00109805:
      iVar6 = -0xe;
      goto LAB_0010a3cb;
    }
    session->server_hostkey_len = (uint32_t)hostkey_len;
    puVar16 = (uchar *)(*session->alloc)(hostkey_len & 0xffffffff,&session->abstract);
    session->server_hostkey = puVar16;
    if (puVar16 == (uchar *)0x0) {
      pcVar22 = "Unable to allocate memory for a copy of the host curve25519 key";
LAB_00109999:
      iVar6 = -6;
      goto LAB_0010a3cb;
    }
    memcpy(puVar16,(void *)CONCAT44(server_host_key._4_4_,(int)server_host_key),
           (ulong)session->server_hostkey_len);
    iVar6 = _libssh2_md5_init(&fingerprint_ctx);
    if ((iVar6 == 0) ||
       (iVar6 = _libssh2_md5_update(&fingerprint_ctx,session->server_hostkey,
                                    (ulong)session->server_hostkey_len), iVar6 == 0)) {
LAB_001098b2:
      iVar13 = 0;
    }
    else {
      iVar6 = _libssh2_md5_final(&fingerprint_ctx,session->server_hostkey_md5);
      iVar13 = 1;
      if (iVar6 == 0) goto LAB_001098b2;
    }
    session->server_hostkey_md5_valid = iVar13;
    iVar6 = _libssh2_sha1_init(&fingerprint_ctx);
    if ((iVar6 == 0) ||
       (iVar6 = _libssh2_sha1_update
                          (&fingerprint_ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len), iVar6 == 0)) {
LAB_001098ff:
      iVar13 = 0;
    }
    else {
      iVar6 = _libssh2_sha1_final(&fingerprint_ctx,session->server_hostkey_sha1);
      iVar13 = 1;
      if (iVar6 == 0) goto LAB_001098ff;
    }
    session->server_hostkey_sha1_valid = iVar13;
    iVar6 = _libssh2_sha256_init(&fingerprint_ctx);
    if ((iVar6 == 0) ||
       (iVar6 = _libssh2_sha256_update
                          (&fingerprint_ctx,session->server_hostkey,
                           (ulong)session->server_hostkey_len), iVar6 == 0)) {
LAB_0010994c:
      iVar13 = 0;
    }
    else {
      iVar6 = _libssh2_sha256_final(&fingerprint_ctx,session->server_hostkey_sha256);
      iVar13 = 1;
      if (iVar6 == 0) goto LAB_0010994c;
    }
    session->server_hostkey_sha256_valid = iVar13;
    iVar6 = (*session->hostkey->init)
                      (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                       &session->server_hostkey_abstract);
    if (iVar6 != 0) {
      pcVar22 = "Unable to initialize hostkey importer curve25519";
      goto LAB_00109985;
    }
    iVar6 = _libssh2_get_string((string_buf *)&s,&server_public_key,&server_public_key_len);
    if (iVar6 != 0) {
      pcVar22 = "Unexpected curve25519 key length";
      goto LAB_00109805;
    }
    if (CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len) == 0x20) {
      ppuVar1 = &(key_state->exchange_state).h_sig;
      outlen = &(key_state->exchange_state).h_sig_len;
      local_78 = &session->server_hostkey_abstract;
      iVar6 = _libssh2_get_string((string_buf *)&s,ppuVar1,outlen);
      if (iVar6 != 0) {
        pcVar22 = "Unexpected curve25519 server sig length";
        goto LAB_00109985;
      }
      local_40 = outlen;
      iVar6 = _libssh2_curve25519_gen_k
                        (&(key_state->exchange_state).k,private_key,
                         (uint8_t *)CONCAT44(server_public_key._4_4_,(int)server_public_key));
      if (iVar6 != 0) {
        pcVar22 = "Unable to create curve25519 shared secret";
        iVar6 = -5;
        goto LAB_0010a3cb;
      }
      local_48 = ppuVar1;
      iVar13 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      iVar6 = iVar13 + 0xe;
      if (-1 < iVar13 + 7) {
        iVar6 = iVar13 + 7;
      }
      (key_state->exchange_state).k_value_len = (long)((iVar6 >> 3) + 5);
      uVar7 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      sVar21 = (key_state->exchange_state).k_value_len;
      if ((uVar7 & 7) != 0) {
        sVar21 = sVar21 - 1;
        (key_state->exchange_state).k_value_len = sVar21;
      }
      puVar16 = (uchar *)(*session->alloc)(sVar21,&session->abstract);
      (key_state->exchange_state).k_value = puVar16;
      if (puVar16 == (uchar *)0x0) {
        pcVar22 = "Unable to allocate buffer for K";
        goto LAB_00109999;
      }
      _libssh2_htonu32(puVar16,(int)(key_state->exchange_state).k_value_len - 4);
      uVar7 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
      lVar24 = 4;
      if ((uVar7 & 7) == 0) {
        (key_state->exchange_state).k_value[4] = '\0';
        lVar24 = 5;
      }
      BN_bn2bin((BIGNUM *)(key_state->exchange_state).k,(key_state->exchange_state).k_value + lVar24
               );
      iVar6 = _libssh2_sha256_init(&fingerprint_ctx);
      if (iVar6 == 0) {
LAB_00109dcf:
        pcVar22 = "Unable to verify hostkey signature curve25519";
        iVar6 = -0xb;
        goto LAB_0010a3cb;
      }
      (key_state->exchange_state).exchange_hash = &fingerprint_ctx;
      puVar25 = (session->local).banner;
      puVar16 = (key_state->exchange_state).h_sig_comp;
      local_88 = puVar16;
      if (puVar25 == (uchar *)0x0) {
        _libssh2_htonu32(puVar16,0x1a);
        uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar16,4);
        pcVar22 = "SSH-2.0-libssh2_1.11.1_DEV";
        sVar21 = 0x1a;
      }
      else {
        sVar15 = strlen((char *)puVar25);
        puVar16 = local_88;
        _libssh2_htonu32(local_88,(int)sVar15 - 2);
        uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar16,4);
        pcVar22 = (char *)(session->local).banner;
        sVar15 = strlen(pcVar22);
        sVar21 = sVar15 - 2;
      }
      uVar8 = _libssh2_sha256_update(&fingerprint_ctx,pcVar22,sVar21);
      local_8c = uVar8 & uVar7 & 1;
      sVar15 = strlen((char *)(session->remote).banner);
      puVar25 = local_88;
      _libssh2_htonu32(local_88,(uint32_t)sVar15);
      local_64 = _libssh2_sha256_update(&fingerprint_ctx,puVar25,4);
      puVar16 = (session->remote).banner;
      sVar15 = strlen((char *)puVar16);
      uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar16,sVar15);
      uVar7 = uVar7 & local_64;
      _libssh2_htonu32(puVar25,(uint32_t)(session->local).kexinit_len);
      uVar8 = _libssh2_sha256_update(&fingerprint_ctx,puVar25,4);
      uVar9 = _libssh2_sha256_update
                        (&fingerprint_ctx,(session->local).kexinit,(session->local).kexinit_len);
      local_8c = uVar9 & uVar8 & uVar7 & local_8c;
      _libssh2_htonu32(puVar25,(uint32_t)(session->remote).kexinit_len);
      uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar25,4);
      uVar8 = _libssh2_sha256_update
                        (&fingerprint_ctx,(session->remote).kexinit,(session->remote).kexinit_len);
      _libssh2_htonu32(puVar25,session->server_hostkey_len);
      uVar9 = _libssh2_sha256_update(&fingerprint_ctx,puVar25,4);
      uVar10 = _libssh2_sha256_update
                         (&fingerprint_ctx,session->server_hostkey,
                          (ulong)session->server_hostkey_len);
      puVar16 = local_88;
      _libssh2_htonu32(local_88,0x20);
      uVar11 = _libssh2_sha256_update(&fingerprint_ctx,puVar16,4);
      uVar12 = _libssh2_sha256_update(&fingerprint_ctx,puVar17,0x20);
      puVar16 = local_88;
      uVar10 = uVar12 & uVar11 & uVar10 & uVar9 & uVar8 & uVar7 & local_8c;
      _libssh2_htonu32(local_88,(uint32_t)server_public_key_len);
      uVar7 = _libssh2_sha256_update(&fingerprint_ctx,puVar16,4);
      uVar8 = _libssh2_sha256_update
                        (&fingerprint_ctx,
                         (void *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                         CONCAT44(server_public_key_len._4_4_,(uint32_t)server_public_key_len));
      uVar9 = _libssh2_sha256_update
                        (&fingerprint_ctx,(key_state->exchange_state).k_value,
                         (key_state->exchange_state).k_value_len);
      if ((((uVar8 & uVar7 & uVar10 & uVar9) == 0) ||
          (iVar6 = _libssh2_sha256_final(&fingerprint_ctx,local_88), iVar6 == 0)) ||
         (iVar6 = (*session->hostkey->sig_verify)
                            (session,*local_48,*local_40,local_88,0x20,local_78), iVar6 != 0))
      goto LAB_00109dcf;
      (key_state->exchange_state).c = '\x15';
      (key_state->exchange_state).state = libssh2_NB_state_sent;
switchD_001097ba_caseD_3:
      iVar6 = _libssh2_transport_send(session,&(key_state->exchange_state).c,1,(uchar *)0x0,0);
      if (iVar6 == -0x25) {
        return -0x25;
      }
      if (iVar6 != 0) {
        pcVar22 = "Unable to send NEWKEYS message curve25519";
        goto LAB_0010a3cb;
      }
      (key_state->exchange_state).state = libssh2_NB_state_sent2;
switchD_001097ba_caseD_5:
      ppuVar1 = &(key_state->exchange_state).tmp;
      iVar6 = _libssh2_packet_require
                        (session,'\x15',ppuVar1,&(key_state->exchange_state).tmp_len,0,(uchar *)0x0,
                         0,&(key_state->exchange_state).req_state);
      if (iVar6 == -0x25) {
        return -0x25;
      }
      if (iVar6 != 0) {
        pcVar22 = "Timed out waiting for NEWKEYS curve25519";
        goto LAB_0010a3cb;
      }
      *(byte *)&session->state = (byte)session->state | 4;
      (*session->free)(*ppuVar1,&session->abstract);
      if (session->session_id == (uchar *)0x0) {
        puVar16 = (uchar *)(*session->alloc)(0x20,&session->abstract);
        session->session_id = puVar16;
        if (puVar16 == (uchar *)0x0) {
          pcVar22 = "Unable to allocate buffer for SHA digest";
          goto LAB_00109999;
        }
        uVar3 = *(undefined8 *)(key_state->exchange_state).h_sig_comp;
        uVar4 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 8);
        uVar5 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x18);
        *(undefined8 *)(puVar16 + 0x10) =
             *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x10);
        *(undefined8 *)(puVar16 + 0x18) = uVar5;
        *(undefined8 *)puVar16 = uVar3;
        *(undefined8 *)(puVar16 + 8) = uVar4;
        session->session_id_len = 0x20;
      }
      pLVar18 = (session->local).crypt;
      if (pLVar18->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*pLVar18->dtor)(session,&(session->local).crypt_abstract);
        pLVar18 = (session->local).crypt;
      }
      if (pLVar18->init !=
          (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
           *)0x0) {
        server_public_key._0_4_ = 0;
        server_host_key._0_4_ = 0;
        puVar16 = (uchar *)(*session->alloc)((long)pLVar18->iv_len + 0x20,&session->abstract);
        if (puVar16 == (uchar *)0x0) {
LAB_0010a4aa:
          iVar6 = -1;
          goto switchD_001097ba_caseD_1;
        }
        pLVar18 = (session->local).crypt;
        if (pLVar18->iv_len != 0) {
          sVar21 = 0;
          do {
            iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar6 == 0) ||
                (iVar6 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
               (iVar6 = _libssh2_sha256_update
                                  ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20),
               iVar6 == 0)) {
LAB_0010a4a0:
              (*session->free)(puVar16,&session->abstract);
              goto LAB_0010a4aa;
            }
            uVar23 = sVar21;
            puVar17 = puVar16;
            if (sVar21 == 0) {
              iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"A",1);
              if (iVar6 == 0) goto LAB_0010a4a0;
              uVar23 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar17,uVar23);
            if ((iVar6 == 0) ||
               (iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar16 + sVar21), iVar6 == 0))
            goto LAB_0010a4a0;
            sVar21 = sVar21 + 0x20;
            pLVar18 = (session->local).crypt;
          } while (sVar21 < (ulong)(long)pLVar18->iv_len);
        }
        puVar17 = (uchar *)(*session->alloc)((long)pLVar18->secret_len + 0x20,&session->abstract);
        if (puVar17 == (uchar *)0x0) goto LAB_0010a4cd;
        pLVar18 = (session->local).crypt;
        if (pLVar18->secret_len != 0) {
          local_78 = (void **)(key_state->exchange_state).h_sig_comp;
          sVar21 = 0;
          do {
            iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar6 == 0) ||
                (iVar6 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
               (iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_78,0x20), iVar6 == 0))
            goto LAB_0010a4c0;
            uVar23 = sVar21;
            puVar25 = puVar17;
            if (sVar21 == 0) {
              iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"C",1);
              if (iVar6 == 0) goto LAB_0010a4c0;
              uVar23 = (ulong)session->session_id_len;
              puVar25 = session->session_id;
            }
            iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar25,uVar23);
            if ((iVar6 == 0) ||
               (iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar17 + sVar21), iVar6 == 0))
            goto LAB_0010a4c0;
            sVar21 = sVar21 + 0x20;
            pLVar18 = (session->local).crypt;
          } while (sVar21 < (ulong)(long)pLVar18->secret_len);
        }
        iVar6 = (*pLVar18->init)(session,pLVar18,puVar16,(int *)&server_public_key,puVar17,
                                 (int *)&server_host_key,1,&(session->local).crypt_abstract);
        puVar25 = puVar16;
        if (iVar6 == 0) {
          if ((int)server_public_key != 0) {
            explicit_bzero(puVar16,(long)((session->local).crypt)->iv_len);
            (*session->free)(puVar16,&session->abstract);
          }
          if ((int)server_host_key != 0) {
            explicit_bzero(puVar17,(long)((session->local).crypt)->secret_len);
            (*session->free)(puVar17,&session->abstract);
          }
          goto LAB_0010a151;
        }
LAB_0010a3a3:
        puVar16 = puVar17;
        (*session->free)(puVar25,&session->abstract);
        goto LAB_0010a4cd;
      }
LAB_0010a151:
      pLVar18 = (session->remote).crypt;
      if (pLVar18->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*pLVar18->dtor)(session,&(session->remote).crypt_abstract);
        pLVar18 = (session->remote).crypt;
      }
      if (pLVar18->init !=
          (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
           *)0x0) {
        server_public_key._0_4_ = 0;
        server_host_key._0_4_ = 0;
        puVar16 = (uchar *)(*session->alloc)((long)pLVar18->iv_len + 0x20,&session->abstract);
        if (puVar16 == (uchar *)0x0) goto LAB_0010a4d4;
        pLVar18 = (session->remote).crypt;
        if (pLVar18->iv_len != 0) {
          sVar21 = 0;
          do {
            iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar6 == 0) ||
                (iVar6 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
               (iVar6 = _libssh2_sha256_update
                                  ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20),
               iVar6 == 0)) goto LAB_0010a4cd;
            uVar23 = sVar21;
            puVar17 = puVar16;
            if (sVar21 == 0) {
              iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"B",1);
              if (iVar6 == 0) goto LAB_0010a4cd;
              uVar23 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar17,uVar23);
            if ((iVar6 == 0) ||
               (iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar16 + sVar21), iVar6 == 0))
            goto LAB_0010a4cd;
            sVar21 = sVar21 + 0x20;
            pLVar18 = (session->remote).crypt;
          } while (sVar21 < (ulong)(long)pLVar18->iv_len);
        }
        puVar17 = (uchar *)(*session->alloc)((long)pLVar18->secret_len + 0x20,&session->abstract);
        if (puVar17 == (uchar *)0x0) goto LAB_0010a4cd;
        pLVar18 = (session->remote).crypt;
        if (pLVar18->secret_len != 0) {
          local_78 = (void **)(key_state->exchange_state).h_sig_comp;
          sVar21 = 0;
          do {
            iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar6 == 0) ||
                (iVar6 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
               (iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,local_78,0x20), iVar6 == 0))
            goto LAB_0010a4c0;
            uVar23 = sVar21;
            puVar25 = puVar17;
            if (sVar21 == 0) {
              iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"D",1);
              if (iVar6 == 0) goto LAB_0010a4c0;
              uVar23 = (ulong)session->session_id_len;
              puVar25 = session->session_id;
            }
            iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar25,uVar23);
            if ((iVar6 == 0) ||
               (iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar17 + sVar21), iVar6 == 0))
            goto LAB_0010a4c0;
            sVar21 = sVar21 + 0x20;
            pLVar18 = (session->remote).crypt;
          } while (sVar21 < (ulong)(long)pLVar18->secret_len);
        }
        iVar6 = (*pLVar18->init)(session,pLVar18,puVar16,(int *)&server_public_key,puVar17,
                                 (int *)&server_host_key,0,&(session->remote).crypt_abstract);
        puVar25 = puVar16;
        if (iVar6 != 0) goto LAB_0010a3a3;
        if ((int)server_public_key != 0) {
          explicit_bzero(puVar16,(long)((session->remote).crypt)->iv_len);
          (*session->free)(puVar16,&session->abstract);
        }
        if ((int)server_host_key != 0) {
          explicit_bzero(puVar17,(long)((session->remote).crypt)->secret_len);
          (*session->free)(puVar17,&session->abstract);
        }
      }
      p_Var19 = (session->local).mac;
      if (p_Var19->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*p_Var19->dtor)(session,&(session->local).mac_abstract);
        p_Var19 = (session->local).mac;
      }
      if (p_Var19->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
        server_public_key._0_4_ = 0;
        puVar16 = (uchar *)(*session->alloc)((long)p_Var19->key_len + 0x20,&session->abstract);
        if (puVar16 == (uchar *)0x0) goto LAB_0010a4d4;
        p_Var19 = (session->local).mac;
        if (p_Var19->key_len != 0) {
          sVar21 = 0;
          do {
            iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar6 == 0) ||
                (iVar6 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
               (iVar6 = _libssh2_sha256_update
                                  ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20),
               iVar6 == 0)) goto LAB_0010a4cd;
            uVar23 = sVar21;
            puVar17 = puVar16;
            if (sVar21 == 0) {
              iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"E",1);
              if (iVar6 == 0) goto LAB_0010a4cd;
              uVar23 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar17,uVar23);
            if ((iVar6 == 0) ||
               (iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar16 + sVar21), iVar6 == 0))
            goto LAB_0010a4cd;
            sVar21 = sVar21 + 0x20;
            p_Var19 = (session->local).mac;
          } while (sVar21 < (ulong)(long)p_Var19->key_len);
        }
        (*p_Var19->init)(session,puVar16,(int *)&server_public_key,&(session->local).mac_abstract);
        if ((int)server_public_key != 0) {
          explicit_bzero(puVar16,(long)((session->local).mac)->key_len);
          (*session->free)(puVar16,&session->abstract);
        }
      }
      p_Var19 = (session->remote).mac;
      if (p_Var19->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
        (*p_Var19->dtor)(session,&(session->remote).mac_abstract);
        p_Var19 = (session->remote).mac;
      }
      if (p_Var19->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
        server_public_key._0_4_ = 0;
        puVar16 = (uchar *)(*session->alloc)((long)p_Var19->key_len + 0x20,&session->abstract);
        if (puVar16 == (uchar *)0x0) goto LAB_0010a4d4;
        p_Var19 = (session->remote).mac;
        if (p_Var19->key_len != 0) {
          sVar21 = 0;
          do {
            iVar6 = _libssh2_sha256_init((EVP_MD_CTX **)&s);
            if (((iVar6 == 0) ||
                (iVar6 = _libssh2_sha256_update
                                   ((EVP_MD_CTX **)&s,(key_state->exchange_state).k_value,
                                    (key_state->exchange_state).k_value_len), iVar6 == 0)) ||
               (iVar6 = _libssh2_sha256_update
                                  ((EVP_MD_CTX **)&s,(key_state->exchange_state).h_sig_comp,0x20),
               iVar6 == 0)) goto LAB_0010a4cd;
            uVar23 = sVar21;
            puVar17 = puVar16;
            if (sVar21 == 0) {
              iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,"F",1);
              if (iVar6 == 0) goto LAB_0010a4cd;
              uVar23 = (ulong)session->session_id_len;
              puVar17 = session->session_id;
            }
            iVar6 = _libssh2_sha256_update((EVP_MD_CTX **)&s,puVar17,uVar23);
            if ((iVar6 == 0) ||
               (iVar6 = _libssh2_sha256_final((EVP_MD_CTX **)&s,puVar16 + sVar21), iVar6 == 0))
            goto LAB_0010a4cd;
            sVar21 = sVar21 + 0x20;
            p_Var19 = (session->remote).mac;
          } while (sVar21 < (ulong)(long)p_Var19->key_len);
        }
        (*p_Var19->init)(session,puVar16,(int *)&server_public_key,&(session->remote).mac_abstract);
        if ((int)server_public_key != 0) {
          explicit_bzero(puVar16,(long)((session->remote).mac)->key_len);
          (*session->free)(puVar16,&session->abstract);
        }
      }
      pLVar20 = (session->local).comp;
      if (pLVar20 != (LIBSSH2_COMP_METHOD *)0x0) {
        if (pLVar20->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          (*pLVar20->dtor)(session,1,&(session->local).comp_abstract);
          pLVar20 = (session->local).comp;
          if (pLVar20 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_0010a84b;
        }
        if (pLVar20->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          iVar13 = (*pLVar20->init)(session,1,&(session->local).comp_abstract);
          iVar6 = -5;
          if (iVar13 != 0) goto switchD_001097ba_caseD_1;
        }
      }
LAB_0010a84b:
      pLVar20 = (session->remote).comp;
      iVar6 = 0;
      if (pLVar20 != (LIBSSH2_COMP_METHOD *)0x0) {
        if (pLVar20->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          iVar6 = 0;
          (*pLVar20->dtor)(session,0,&(session->remote).comp_abstract);
          pLVar20 = (session->remote).comp;
          if (pLVar20 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_001097ba_caseD_1;
        }
        iVar6 = 0;
        if (pLVar20->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
          iVar6 = (*pLVar20->init)(session,0,&(session->remote).comp_abstract);
          iVar6 = (uint)(iVar6 == 0) * 5 + -5;
        }
      }
    }
    else {
      pcVar22 = "Unexpected curve25519 server public key length";
LAB_00109985:
      iVar6 = -10;
LAB_0010a3cb:
      iVar6 = _libssh2_error(session,iVar6,pcVar22);
    }
switchD_001097ba_caseD_1:
    BN_clear_free((BIGNUM *)(key_state->exchange_state).k);
    (key_state->exchange_state).k = (BIGNUM *)0x0;
    puVar16 = (key_state->exchange_state).k_value;
    if (puVar16 != (uchar *)0x0) {
      (*session->free)(puVar16,&session->abstract);
      (key_state->exchange_state).k_value = (uchar *)0x0;
    }
    (key_state->exchange_state).state = libssh2_NB_state_idle;
  }
  if (iVar6 == -0x25) {
    return -0x25;
  }
  (*session->free)(key_state->data,&session->abstract);
switchD_00109619_caseD_1:
  if (key_state->curve25519_public_key != (uchar *)0x0) {
    explicit_bzero(key_state->curve25519_public_key,0x20);
    (*session->free)(key_state->curve25519_public_key,&session->abstract);
    key_state->curve25519_public_key = (uchar *)0x0;
  }
  if (key_state->curve25519_private_key != (uchar *)0x0) {
    explicit_bzero(key_state->curve25519_private_key,0x20);
    (*session->free)(key_state->curve25519_private_key,&session->abstract);
    key_state->curve25519_private_key = (uchar *)0x0;
  }
  key_state->state = libssh2_NB_state_idle;
  return iVar6;
}

Assistant:

static int
kex_method_curve25519_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        unsigned char *s = NULL;

        rc = strcmp(session->kex->name, "curve25519-sha256@libssh.org");
        if(rc)
            rc = strcmp(session->kex->name, "curve25519-sha256");

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX curve25519 curve type");
            goto clean_exit;
        }

        rc = _libssh2_curve25519_new(session,
                                     &key_state->curve25519_public_key,
                                     &key_state->curve25519_private_key);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->curve25519_public_key,
                           LIBSSH2_ED25519_KEY_LEN);
        key_state->request_len = LIBSSH2_ED25519_KEY_LEN + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating curve25519 SHA2"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        ret = curve25519_sha256(session, key_state->data, key_state->data_len,
                                key_state->curve25519_public_key,
                                key_state->curve25519_private_key,
                                &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

clean_exit:

    if(key_state->curve25519_public_key) {
        _libssh2_explicit_zero(key_state->curve25519_public_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_public_key);
        key_state->curve25519_public_key = NULL;
    }

    if(key_state->curve25519_private_key) {
        _libssh2_explicit_zero(key_state->curve25519_private_key,
                               LIBSSH2_ED25519_KEY_LEN);
        LIBSSH2_FREE(session, key_state->curve25519_private_key);
        key_state->curve25519_private_key = NULL;
    }

    key_state->state = libssh2_NB_state_idle;

    return ret;
}